

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O0

void profile_trigger(ProfileState *ps)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  long *in_RDI;
  global_State *in_stack_00000010;
  int st;
  uint8_t mask;
  global_State *g;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  lVar3 = *in_RDI;
  *(int *)(in_RDI + 5) = (int)in_RDI[5] + 1;
  bVar1 = *(byte *)(lVar3 + 0x109);
  if ((bVar1 & 0xe0) == 0) {
    iVar2 = *(int *)(lVar3 + 0x160);
    if (iVar2 < 0) {
      if (iVar2 == -1) {
        local_20 = 0x49;
      }
      else {
        if (iVar2 == -2) {
          local_24 = 0x49;
        }
        else {
          if (iVar2 == -3) {
            local_28 = 0x49;
          }
          else {
            if (iVar2 == -4) {
              local_2c = 0x43;
            }
            else {
              local_2c = 0x4a;
              if (iVar2 == -5) {
                local_2c = 0x47;
              }
            }
            local_28 = local_2c;
          }
          local_24 = local_28;
        }
        local_20 = local_24;
      }
      local_1c = local_20;
    }
    else {
      local_1c = 0x4e;
    }
    *(undefined4 *)((long)in_RDI + 0x2c) = local_1c;
    *(byte *)(lVar3 + 0x109) = bVar1 | 0x80;
    lj_dispatch_update(in_stack_00000010);
  }
  return;
}

Assistant:

static void profile_trigger(ProfileState *ps)
{
  global_State *g = ps->g;
  uint8_t mask;
  profile_lock(ps);
  ps->samples++;  /* Always increment number of samples. */
  mask = g->hookmask;
  if (!(mask & (HOOK_PROFILE|HOOK_VMEVENT|HOOK_GC))) {  /* Set profile hook. */
    int st = g->vmstate;
    ps->vmstate = st >= 0 ? 'N' :
		  st == ~LJ_VMST_INTERP ? 'I' :
		  /* Stubs for profiler hooks. */
		  st == ~LJ_VMST_LFUNC ? 'I' :
		  st == ~LJ_VMST_FFUNC ? 'I' :
		  st == ~LJ_VMST_CFUNC ? 'C' :
		  st == ~LJ_VMST_GC ? 'G' : 'J';
    g->hookmask = (mask | HOOK_PROFILE);
    lj_dispatch_update(g);
  }
  profile_unlock(ps);
}